

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O3

void __thiscall
tchecker::typed_local_var_statement_t::typed_local_var_statement_t
          (typed_local_var_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_var_expression_t> *variable,
          shared_ptr<const_tchecker::typed_expression_t> *init)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<const_tchecker::expression_t> local_28;
  shared_ptr<const_tchecker::var_expression_t> local_18;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0027e888;
  (this->super_typed_statement_t)._type = type;
  peVar1 = (variable->
           super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&(peVar1->super_typed_lvalue_expression_t).field_0x10;
  if (peVar1 == (element_type *)0x0) {
    local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
  }
  local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (variable->
       super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.
            super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.
            super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (init->super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)((long)&peVar2->field_0x0 + *(long *)(*(long *)peVar2 + -0x38));
  }
  local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (init->super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>)
          ._M_refcount._M_pi;
  if (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_var_statement_t::local_var_statement_t
            (&this->super_local_var_statement_t,&PTR_construction_vtable_56__0027d938,&local_18,
             &local_28);
  if (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_18.super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.
               super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(undefined8 *)&this->super_typed_statement_t = 0x27d880;
  *(undefined8 *)&this->super_local_var_statement_t = 0x27d8f0;
  return;
}

Assistant:

typed_local_var_statement_t::typed_local_var_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_var_expression_t const> const & variable,
    std::shared_ptr<tchecker::typed_expression_t const> const & init)
    : tchecker::typed_statement_t(type), tchecker::local_var_statement_t(variable, init)
{
}